

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint_t __thiscall shm_test::ServerThread::threadFunc(ServerThread *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 *puVar4;
  ReqHdr reply;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_58;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_38;
  ulong uVar3;
  
  local_38.m_p = (char *)0x0;
  local_38.m_hdr = (Hdr *)0x0;
  local_38.m_count = 0;
  do {
    iVar2 = (**this->m_transport->_vptr_Transport)(this->m_transport,&local_38);
    uVar3 = CONCAT44(extraout_var,iVar2);
    if (uVar3 == 0xffffffffffffffff) {
      axl::err::getLastErrorDescription();
      if (local_58.m_length == 0) {
        puVar4 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      else {
        puVar4 = (undefined1 *)CONCAT44(local_58.m_p._4_4_,local_58.m_p._0_4_);
      }
      printf("server: read error: %s\n",puVar4);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_58);
LAB_0011d72f:
      axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_38);
      return 0xffffffff;
    }
    if (uVar3 < 8) {
      puts("server: buffer too small");
      goto LAB_0011d72f;
    }
    uVar1 = *(uint *)((long)local_38.m_p + 4);
    if ((*(uint *)local_38.m_p != 0) || ((ulong)uVar1 + 8 != uVar3)) {
      printf("server: invalid command: %d (%d)\n",(ulong)*(uint *)local_38.m_p,(ulong)uVar1);
      goto LAB_0011d72f;
    }
    local_58.m_p._0_4_ = 1;
    local_58.m_p._4_4_ = uVar1;
    (*this->m_transport->_vptr_Transport[1])(this->m_transport,&local_58,threadFunc::data);
  } while( true );
}

Assistant:

uint_t
	threadFunc() {
		ASSERT(m_transport);

		sl::Array<char> buffer;

		static char data[MaxBlockSize] = { 0 };

		for (;;) {
			size_t size = m_transport->readMessage(&buffer);
			if (size == -1) {
				printf("server: read error: %s\n", err::getLastErrorDescription().sz());
				return -1;
			}

			if (size < sizeof(ReqHdr)) {
				printf("server: buffer too small\n");
				return -1;
			}

			ReqHdr* command = (ReqHdr*)buffer.cp();
			if (command->m_code != ReqCode_Command || sizeof(ReqHdr) + command->m_size != size) {
				printf("server: invalid command: %d (%d)\n", command->m_code, command->m_size);
				return -1;
			}

			ReqHdr reply;
			reply.m_code = ReqCode_Reply;
			reply.m_size = command->m_size;

			m_transport->writeMessage(&reply, data, reply.m_size);
		}

		return 0;
	}